

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.hpp
# Opt level: O0

void __thiscall wire::string::string<unsigned_int>(string *this,uint *t)

{
  bool bVar1;
  long *plVar2;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  undefined1 local_190 [376];
  uint *local_18;
  uint *t_local;
  string *this_local;
  
  local_18 = t;
  t_local = (uint *)this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::stringstream::stringstream(local_1a0);
  plVar2 = (long *)std::ostream::operator<<(local_190,*local_18);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
  if (bVar1) {
    std::__cxx11::stringstream::str();
    std::__cxx11::string::assign((string *)this);
    std::__cxx11::string::~string(local_1d0);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

string( const T &t ) : std::string()
        {
            std::stringstream ss;
            if( ss << /* std::boolalpha << */ t )
                this->assign( ss.str() );
        }